

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O2

void __thiscall
Rml::FilterDropShadow::ExtendInkOverflow
          (FilterDropShadow *this,Element *element,Rectanglef *scissor_region)

{
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2Type bottom_right;
  Vector2Type top_left;
  float fVar3;
  float fVar4;
  float fVar5;
  Rectangle<float> RVar6;
  
  fVar3 = Element::ResolveLength(element,this->value_sigma);
  fVar4 = Element::ResolveLength(element,this->value_offset_x);
  fVar5 = Element::ResolveLength(element,this->value_offset_y);
  fVar3 = fVar3 * 3.0;
  VVar1 = Math::Max<Rml::Vector2<float>>
                    ((Vector2f)(CONCAT44(fVar5,fVar4) ^ 0x8000000080000000),(Vector2f)0x0);
  VVar2.y = fVar5;
  VVar2.x = fVar4;
  VVar2 = Math::Max<Rml::Vector2<float>>(VVar2,(Vector2f)0x0);
  top_left.y = VVar1.y + fVar3;
  top_left.x = VVar1.x + fVar3;
  bottom_right.y = fVar3 + VVar2.y;
  bottom_right.x = fVar3 + VVar2.x;
  RVar6 = Rectangle<float>::Extend(scissor_region,top_left,bottom_right);
  scissor_region->p0 = RVar6.p0;
  scissor_region->p1 = RVar6.p1;
  return;
}

Assistant:

void FilterDropShadow::ExtendInkOverflow(Element* element, Rectanglef& scissor_region) const
{
	// Expand the ink overflow area to cover both the native element *and* its offset shadow w/blur.
	const float sigma = element->ResolveLength(value_sigma);
	const Vector2f offset = {
		element->ResolveLength(value_offset_x),
		element->ResolveLength(value_offset_y),
	};

	const float blur_extent = 3.f * sigma;
	scissor_region =
		scissor_region.Extend(Math::Max(-offset, Vector2f(0.f)) + Vector2f(blur_extent), Math::Max(offset, Vector2f(0.f)) + Vector2f(blur_extent));
}